

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusBGPlanner.cpp
# Opt level: O0

QFunctionsDiscrete * __thiscall
PerseusBGPlanner::BackupStageAll(PerseusBGPlanner *this,BeliefSet *S,QFunctionsDiscrete *Q)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  size_t sVar4;
  ostream *this_00;
  reference pvVar5;
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  *in_RCX;
  vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *in_RDX;
  BeliefSet *in_RSI;
  Perseus *in_RDI;
  uint a;
  int k;
  ValueFunctionPOMDPDiscrete Qalphas;
  GaoVectorSet Gao;
  ValueFunctionPOMDPDiscrete V;
  AlphaVector alpha;
  int nrS;
  int nrB;
  vector<double,_std::allocator<double>_> VBalpha;
  vector<double,_std::allocator<double>_> VB;
  QFunctionsDiscrete *Q1;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffd60;
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  *this_01;
  AlphaVector *in_stack_fffffffffffffd68;
  ostream *in_stack_fffffffffffffd70;
  size_t in_stack_fffffffffffffd78;
  AlphaVector *in_stack_fffffffffffffd80;
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  *in_stack_fffffffffffffd88;
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  Perseus *this_02;
  ValueFunctionPOMDPDiscrete *V_00;
  QFunctionsDiscrete *in_stack_fffffffffffffe10;
  GaoVectorSet *in_stack_fffffffffffffe18;
  Perseus *in_stack_fffffffffffffe20;
  ValueFunctionPOMDPDiscrete *in_stack_fffffffffffffe78;
  GaoVectorSet *in_stack_fffffffffffffe80;
  Index in_stack_fffffffffffffe8c;
  JointBeliefInterface *in_stack_fffffffffffffe90;
  AlphaVectorBG *in_stack_fffffffffffffe98;
  BGBackupType in_stack_fffffffffffffeb0;
  uint local_148;
  int local_144;
  vector<double,_std::allocator<double>_> local_50;
  ValueFunctionPOMDPDiscrete local_38;
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  *local_20;
  vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *local_18;
  
  V_00 = &local_38;
  this_02 = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  BeliefValue::GetValues((BeliefSet *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x93fa19);
  sVar3 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)V_00);
  AlphaVectorPlanning::GetPU
            ((AlphaVectorPlanning *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  PlanningUnitMADPDiscrete::GetNrStates(in_stack_fffffffffffffd60);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::size(local_20);
  std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>::allocator
            ((allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_> *)0x93fa9a);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
            *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
           (allocator_type *)in_stack_fffffffffffffd70);
  std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>::~allocator
            ((allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_> *)0x93fabd);
  AlphaVector::AlphaVector(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  AlphaVectorPlanning::QFunctionsToValueFunction
            ((QFunctionsDiscrete *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  Perseus::BackupStageLeadIn(this_02,(ValueFunctionPOMDPDiscrete *)in_RDI);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::vector
            ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)0x93fb1b);
  for (local_144 = 0; local_144 < (int)sVar3; local_144 = local_144 + 1) {
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::clear
              ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)0x93fb47);
    local_148 = 0;
    while( true ) {
      AlphaVectorPlanning::GetPU
                ((AlphaVectorPlanning *)
                 CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      sVar4 = PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x93fb86);
      if (local_148 == sVar4) break;
      std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::operator[]
                (local_18,(long)local_144);
      in_stack_fffffffffffffd58 =
           *(undefined4 *)
            &in_RSI[9].
             super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
      AlphaVectorBG::BeliefBackup
                (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                 in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffeb0);
      AlphaVector::operator=(in_stack_fffffffffffffd68,(AlphaVector *)in_stack_fffffffffffffd60);
      AlphaVector::~AlphaVector((AlphaVector *)0x93fc15);
      std::
      vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
      ::operator[]((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                    *)in_RDI,(ulong)local_148);
      bVar1 = AlphaVectorPlanning::VectorIsInValueFunction
                        ((AlphaVector *)in_stack_fffffffffffffd88,
                         (ValueFunctionPOMDPDiscrete *)in_stack_fffffffffffffd80);
      if (!bVar1) {
        std::
        vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        ::operator[]((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                      *)in_RDI,(ulong)local_148);
        std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back
                  ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffffd70,
                   in_stack_fffffffffffffd68);
      }
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back
                ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffffd70,
                 in_stack_fffffffffffffd68);
      local_148 = local_148 + 1;
    }
    iVar2 = Perseus::GetVerbose((Perseus *)(in_RSI + 1));
    if (iVar2 != 0) {
      BeliefValue::GetValues(in_RSI,V_00);
      in_stack_fffffffffffffd88 =
           (multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
            *)&stack0xfffffffffffffe78;
      std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd70,
                 (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd68);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd70);
      in_stack_fffffffffffffd90 =
           (multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
            *)std::operator<<((ostream *)&std::cout,"Added vectors for ");
      in_stack_fffffffffffffd80 =
           (AlphaVector *)std::ostream::operator<<(in_stack_fffffffffffffd90,local_144);
      this_00 = std::operator<<((ostream *)in_stack_fffffffffffffd80," (V ");
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_50,(long)local_144);
      in_stack_fffffffffffffd70 = (ostream *)std::ostream::operator<<(this_00,*pvVar5);
      in_stack_fffffffffffffd68 = (AlphaVector *)std::operator<<(in_stack_fffffffffffffd70,")");
      std::ostream::operator<<(in_stack_fffffffffffffd68,std::endl<char,std::char_traits<char>>);
    }
  }
  this_01 = (multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
             *)(in_RSI + 1);
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::multi_array(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Perseus::BackupStageLeadOut(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::~multi_array(this_01);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
            ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffffd70);
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::~multi_array(this_01);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
            ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffffd70);
  AlphaVector::~AlphaVector((AlphaVector *)0x93ff13);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd70);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd70);
  return (QFunctionsDiscrete *)this_02;
}

Assistant:

QFunctionsDiscrete
PerseusBGPlanner::BackupStageAll(const BeliefSet &S,
                                 const QFunctionsDiscrete &Q) const
{
    vector<double> VB=BeliefValue::GetValues(S,Q),
        VBalpha;

    int nrB=VB.size(),
        nrS=GetPU()->GetNrStates();
    QFunctionsDiscrete Q1(Q.size());
    AlphaVector alpha(nrS);

    ValueFunctionPOMDPDiscrete V=QFunctionsToValueFunction(Q);
    GaoVectorSet Gao=BackupStageLeadIn(V);

    ValueFunctionPOMDPDiscrete Qalphas;

    for(int k=0;k<nrB;++k)
    {
        Qalphas.clear();
        for(unsigned int a=0;a!=GetPU()->GetNrJointActions();++a)
        {
            // backup the belief
            alpha=BeliefBackup(*S[k],a,Gao,V,_m_backupType);
           
            // add alpha to Q1
            if(!VectorIsInValueFunction(alpha,Q1[a]))
                Q1[a].push_back(alpha);
            Qalphas.push_back(alpha);
        }

        if(GetVerbose())
        {
            VBalpha=BeliefValue::GetValues(S,Qalphas);
            cout << "Added vectors for " << k << " (V " << VBalpha[k] 
                 << ")" << endl;
        }
    }

    BackupStageLeadOut(Gao);

    return(Q1);
}